

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void al_set_app_name(char *app_name)

{
  ALLEGRO_PATH *path;
  char *src;
  
  if (app_name != (char *)0x0) {
    _al_sane_strncpy(_al_app_name,app_name,0x100);
    return;
  }
  path = al_get_standard_path(6);
  src = al_get_path_filename(path);
  _al_sane_strncpy(_al_app_name,src,0x100);
  al_destroy_path(path);
  return;
}

Assistant:

void al_set_app_name(const char *app_name)
{
   if (app_name) {
      _al_sane_strncpy(_al_app_name, app_name, sizeof(_al_app_name));
   }
   else {
      ALLEGRO_PATH *path;
      path = al_get_standard_path(ALLEGRO_EXENAME_PATH);
      _al_sane_strncpy(_al_app_name, al_get_path_filename(path), sizeof(_al_app_name));
      al_destroy_path(path);
   }
}